

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_schema_features.c
# Opt level: O3

void get_features(ly_set *fset,char *module,char ***features)

{
  uint uVar1;
  lyd_node **pplVar2;
  lyd_node *plVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = fset->count;
  if ((ulong)uVar1 != 0) {
    pplVar2 = (fset->field_2).dnodes;
    uVar5 = 0;
    do {
      plVar3 = pplVar2[uVar5];
      iVar4 = strcmp(module,*(char **)plVar3);
      if (iVar4 == 0) {
        *features = (char **)plVar3->schema;
        *(undefined1 *)&plVar3->parent = 1;
        return;
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  *features = (char **)0x0;
  return;
}

Assistant:

void
get_features(const struct ly_set *fset, const char *module, const char ***features)
{
    /* get features list for this module */
    for (uint32_t u = 0; u < fset->count; ++u) {
        struct yl_schema_features *sf = (struct yl_schema_features *)fset->objs[u];

        if (!strcmp(module, sf->mod_name)) {
            /* matched module - explicitly set features */
            *features = (const char **)sf->features;
            sf->applied = 1;
            return;
        }
    }

    /* features not set so disable all */
    *features = NULL;
}